

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

Pubkey * __thiscall
cfd::core::Pubkey::CreateTweakAdd(Pubkey *__return_storage_ptr__,Pubkey *this,ByteData256 *tweak)

{
  ByteData local_50;
  undefined1 local_38 [8];
  ByteData tweak_added;
  ByteData256 *tweak_local;
  Pubkey *this_local;
  
  tweak_added.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)tweak;
  WallyUtil::AddTweakPubkey((ByteData *)local_38,&this->data_,tweak,false);
  ByteData::ByteData(&local_50,(ByteData *)local_38);
  Pubkey(__return_storage_ptr__,&local_50);
  ByteData::~ByteData(&local_50);
  ByteData::~ByteData((ByteData *)local_38);
  return __return_storage_ptr__;
}

Assistant:

Pubkey Pubkey::CreateTweakAdd(const ByteData256 &tweak) const {
  ByteData tweak_added = WallyUtil::AddTweakPubkey(data_, tweak);
  return Pubkey(tweak_added);
}